

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

void CLI::detail::remove_default_flag_values(string *flags)

{
  ulong __pos_00;
  pointer pcVar1;
  undefined8 in_RAX;
  void *pvVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  size_type sVar4;
  ulong uVar5;
  size_type __pos;
  size_type __pos_01;
  undefined8 uStack_38;
  
  uVar5 = flags->_M_string_length;
  uStack_38 = in_RAX;
  if (2 < uVar5) {
    pcVar1 = (flags->_M_dataplus)._M_p;
    pvVar2 = memchr(pcVar1 + 2,0x7b,uVar5 - 2);
    __pos_01 = (long)pvVar2 - (long)pcVar1;
    if (__pos_01 != 0xffffffffffffffff && pvVar2 != (void *)0x0) {
      while( true ) {
        __pos_00 = __pos_01 + 1;
        sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find_first_of(flags,"},",__pos_00,2);
        if ((sVar4 != 0xffffffffffffffff) &&
           (pcVar1 = (flags->_M_dataplus)._M_p, pcVar1[sVar4] == '}')) {
          if (pcVar1 + flags->_M_string_length == pcVar1 + sVar4 + 1) {
            flags->_M_string_length = __pos_01;
            pcVar1[__pos_01] = '\0';
          }
          else {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_erase(flags,__pos_01,(long)(pcVar1 + sVar4 + 1) - (long)(pcVar1 + __pos_01));
          }
        }
        uVar5 = flags->_M_string_length;
        if (uVar5 < __pos_00 || uVar5 - __pos_00 == 0) break;
        pcVar1 = (flags->_M_dataplus)._M_p;
        pvVar2 = memchr(pcVar1 + __pos_00,0x7b,uVar5 - __pos_00);
        if ((pvVar2 == (void *)0x0) ||
           (__pos_01 = (long)pvVar2 - (long)pcVar1, __pos_01 == 0xffffffffffffffff)) break;
      }
    }
  }
  _Var3._M_current = (flags->_M_dataplus)._M_p;
  uStack_38 = CONCAT17(0x21,(undefined7)uStack_38);
  _Var3 = ::std::
          __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (_Var3,_Var3._M_current + uVar5,(char *)((long)&uStack_38 + 7));
  flags->_M_string_length = (long)_Var3._M_current - (long)(flags->_M_dataplus)._M_p;
  *_Var3._M_current = '\0';
  return;
}

Assistant:

CLI11_INLINE void remove_default_flag_values(std::string &flags) {
    auto loc = flags.find_first_of('{', 2);
    while(loc != std::string::npos) {
        auto finish = flags.find_first_of("},", loc + 1);
        if((finish != std::string::npos) && (flags[finish] == '}')) {
            flags.erase(flags.begin() + static_cast<std::ptrdiff_t>(loc),
                        flags.begin() + static_cast<std::ptrdiff_t>(finish) + 1);
        }
        loc = flags.find_first_of('{', loc + 1);
    }
    flags.erase(std::remove(flags.begin(), flags.end(), '!'), flags.end());
}